

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O0

FilePath * testing::internal::FilePath::ConcatPaths(FilePath *directory,FilePath *relative_path)

{
  bool bVar1;
  string *this;
  string *__rhs;
  FilePath *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  FilePath dir;
  FilePath *in_stack_ffffffffffffff48;
  FilePath *in_stack_ffffffffffffff50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs_00;
  string local_78 [16];
  FilePath *in_stack_ffffffffffffff98;
  string local_58 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  FilePath *local_18;
  
  __lhs_00 = in_RDI;
  local_18 = in_RDX;
  bVar1 = IsEmpty((FilePath *)0x14e1d9);
  if (bVar1) {
    FilePath(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  }
  else {
    __lhs = &local_38;
    RemoveTrailingPathSeparator(in_stack_ffffffffffffff98);
    this = string_abi_cxx11_((FilePath *)__lhs);
    std::operator+(__lhs_00,(char)((ulong)this >> 0x38));
    __rhs = string_abi_cxx11_(local_18);
    std::operator+(__lhs,__rhs);
    FilePath((FilePath *)this,__lhs);
    std::__cxx11::string::~string(local_58);
    std::__cxx11::string::~string(local_78);
    ~FilePath((FilePath *)0x14e293);
  }
  return (FilePath *)in_RDI;
}

Assistant:

FilePath FilePath::ConcatPaths(const FilePath& directory,
                               const FilePath& relative_path) {
  if (directory.IsEmpty())
    return relative_path;
  const FilePath dir(directory.RemoveTrailingPathSeparator());
  return FilePath(dir.string() + kPathSeparator + relative_path.string());
}